

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O0

Gia_Man_t * Bac_ManExtract(Bac_Man_t *p,int fBuffers,int fVerbose)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int x;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  int local_44;
  int iObj;
  int i;
  Vec_Int_t *vMap;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Bac_Ntk_t *pRoot;
  Bac_Ntk_t *pNtk;
  int fVerbose_local;
  int fBuffers_local;
  Bac_Man_t *p_local;
  
  pNtk._0_4_ = fVerbose;
  pNtk._4_4_ = fBuffers;
  _fVerbose_local = p;
  pNew = (Gia_Man_t *)Bac_ManRoot(p);
  _iObj = (Vec_Int_t *)0x0;
  Vec_IntClear(&_fVerbose_local->vBuf2LeafNtk);
  Vec_IntClear(&_fVerbose_local->vBuf2LeafObj);
  Vec_IntClear(&_fVerbose_local->vBuf2RootNtk);
  Vec_IntClear(&_fVerbose_local->vBuf2RootObj);
  for (local_44 = 1; iVar2 = Bac_ManNtkNum(_fVerbose_local), local_44 <= iVar2;
      local_44 = local_44 + 1) {
    pRoot = Bac_ManNtk(_fVerbose_local,local_44);
    Bac_NtkDeriveIndex(pRoot);
    Bac_NtkStartCopies(pRoot);
  }
  iVar2 = Bac_ManNodeNum(_fVerbose_local);
  pTemp = Gia_ManStart(iVar2);
  pcVar3 = Abc_UtilStrsav(_fVerbose_local->pName);
  pTemp->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(_fVerbose_local->pSpec);
  pTemp->pSpec = pcVar3;
  for (local_44 = 0; iVar2 = Bac_NtkPiNum((Bac_Ntk_t *)pNew), local_44 < iVar2;
      local_44 = local_44 + 1) {
    iVar2 = Bac_NtkPi((Bac_Ntk_t *)pNew,local_44);
    pGVar1 = pNew;
    x = Gia_ManAppendCi(pTemp);
    Bac_ObjSetCopy((Bac_Ntk_t *)pGVar1,iVar2,x);
  }
  Gia_ManHashAlloc(pTemp);
  pVVar4 = Vec_IntAlloc(10000);
  pTemp->vBarBufs = pVVar4;
  _iObj = Vec_IntStartFull(10000);
  Bac_ManPrepareGates(_fVerbose_local);
  for (local_44 = 0; iVar2 = Bac_NtkPoNum((Bac_Ntk_t *)pNew), local_44 < iVar2;
      local_44 = local_44 + 1) {
    iVar2 = Bac_NtkPo((Bac_Ntk_t *)pNew,local_44);
    Bac_ManExtract_rec(pTemp,(Bac_Ntk_t *)pNew,iVar2,pNtk._4_4_,_iObj);
  }
  Bac_ManUndoGates(_fVerbose_local);
  Vec_IntFreeP((Vec_Int_t **)&iObj);
  Gia_ManHashStop(pTemp);
  for (local_44 = 0; iVar2 = Bac_NtkPoNum((Bac_Ntk_t *)pNew), local_44 < iVar2;
      local_44 = local_44 + 1) {
    iVar2 = Bac_NtkPo((Bac_Ntk_t *)pNew,local_44);
    pGVar1 = pTemp;
    iVar2 = Bac_ObjCopy((Bac_Ntk_t *)pNew,iVar2);
    Gia_ManAppendCo(pGVar1,iVar2);
  }
  iVar2 = Vec_IntSize(&_fVerbose_local->vBuf2LeafNtk);
  if (iVar2 != pTemp->nBufs) {
    __assert_fail("Vec_IntSize(&p->vBuf2LeafNtk) == pNew->nBufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                  ,0x101,"Gia_Man_t *Bac_ManExtract(Bac_Man_t *, int, int)");
  }
  vMap = (Vec_Int_t *)pTemp;
  pTemp = Gia_ManCleanup(pTemp);
  Gia_ManStop((Gia_Man_t *)vMap);
  return pTemp;
}

Assistant:

Gia_Man_t * Bac_ManExtract( Bac_Man_t * p, int fBuffers, int fVerbose )
{
    Bac_Ntk_t * pNtk, * pRoot = Bac_ManRoot(p);
    Gia_Man_t * pNew, * pTemp; 
    Vec_Int_t * vMap = NULL;
    int i, iObj;

    Vec_IntClear( &p->vBuf2LeafNtk );
    Vec_IntClear( &p->vBuf2LeafObj );
    Vec_IntClear( &p->vBuf2RootNtk );
    Vec_IntClear( &p->vBuf2RootObj );

    Bac_ManForEachNtk( p, pNtk, i )
    {
        Bac_NtkDeriveIndex( pNtk );
        Bac_NtkStartCopies( pNtk );
    }

    // start the manager
    pNew = Gia_ManStart( Bac_ManNodeNum(p) );
    pNew->pName = Abc_UtilStrsav(p->pName);
    pNew->pSpec = Abc_UtilStrsav(p->pSpec);

    // primary inputs
    Bac_NtkForEachPi( pRoot, iObj, i )
        Bac_ObjSetCopy( pRoot, iObj, Gia_ManAppendCi(pNew) );

    // internal nodes
    Gia_ManHashAlloc( pNew );
    pNew->vBarBufs = Vec_IntAlloc( 10000 );
    vMap = Vec_IntStartFull( 10000 );
    Bac_ManPrepareGates( p );
    Bac_NtkForEachPo( pRoot, iObj, i )
        Bac_ManExtract_rec( pNew, pRoot, iObj, fBuffers, vMap );
    Bac_ManUndoGates( p );
    Vec_IntFreeP( &vMap );
    Gia_ManHashStop( pNew );

    // primary outputs
    Bac_NtkForEachPo( pRoot, iObj, i )
        Gia_ManAppendCo( pNew, Bac_ObjCopy(pRoot, iObj) );
    assert( Vec_IntSize(&p->vBuf2LeafNtk) == pNew->nBufs );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    //Gia_ManPrintStats( pNew, NULL );
    return pNew;
}